

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

int __thiscall
phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
::verify(btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
         *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  size_type sVar1;
  node_type *pnVar2;
  btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
  *pbVar3;
  ulong uVar4;
  size_type sVar5;
  char *__function;
  node_type *pnVar6;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
  local_28;
  
  pnVar6 = (this->root_).
           super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*>
           .
           super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*>
           .
           super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*>
           .
           super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*,_false>
           ._M_head_impl;
  if (pnVar6 == (node_type *)0x0) {
    __assert_fail("root() != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xb45,
                  "void phmap::priv::btree<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>>::verify() const [Params = phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>]"
                 );
  }
  if (((ulong)pnVar6 & 7) == 0) {
    if (*(long *)pnVar6 == 0) {
      __assert_fail("leftmost() != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0xb46,
                    "void phmap::priv::btree<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>>::verify() const [Params = phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>]"
                   );
    }
    if (this->rightmost_ == (node_type *)0x0) {
      __assert_fail("rightmost_ != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0xb47,
                    "void phmap::priv::btree<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>>::verify() const [Params = phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>]"
                   );
    }
    sVar1 = this->size_;
    if (sVar1 != 0) {
      sVar5 = internal_verify(this,pnVar6,(key_type *)0x0,(key_type *)0x0);
      if (sVar1 != sVar5) {
        __assert_fail("empty() || size() == internal_verify(root(), nullptr, nullptr)",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xb48,
                      "void phmap::priv::btree<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>>::verify() const [Params = phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>]"
                     );
      }
      pnVar6 = (this->root_).
               super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*>
               .
               super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*>
               .
               super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*>
               .
               super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*,_false>
               ._M_head_impl;
    }
    if (((ulong)pnVar6 & 7) == 0) {
      pnVar2 = *(node_type **)pnVar6;
      local_28.position = 0xffffffff;
      local_28.node = pnVar6;
      btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
      ::increment(&local_28);
      if (pnVar2 != local_28.node) {
        __assert_fail("leftmost() == (++const_iterator(root(), -1)).node",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xb49,
                      "void phmap::priv::btree<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>>::verify() const [Params = phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>]"
                     );
      }
      pnVar6 = (this->root_).
               super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*>
               .
               super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*>
               .
               super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*>
               .
               super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*,_false>
               ._M_head_impl;
      if (((ulong)pnVar6 & 7) == 0) {
        pnVar2 = this->rightmost_;
        local_28.position = (int)(byte)pnVar6[10];
        local_28.node = pnVar6;
        btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
        ::decrement(&local_28);
        if (pnVar2 != local_28.node) {
          __assert_fail("rightmost_ == (--const_iterator(root(), root()->count())).node",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0xb4a,
                        "void phmap::priv::btree<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>>::verify() const [Params = phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>]"
                       );
        }
        pbVar3 = (this->root_).
                 super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*>
                 .
                 super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*>
                 .
                 super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*>
                 .
                 super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*,_false>
                 ._M_head_impl;
        if (((ulong)pbVar3 & 7) != 0) goto LAB_001e05aa;
        uVar4 = *(ulong *)pbVar3;
        if ((uVar4 & 7) == 0) {
          if (*(char *)(uVar4 + 0xb) == '\0') {
            __assert_fail("leftmost()->leaf()",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0xb4b,
                          "void phmap::priv::btree<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>>::verify() const [Params = phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>]"
                         );
          }
          pnVar6 = this->rightmost_;
          if (((ulong)pnVar6 & 7) == 0) {
            if (pnVar6[0xb] != (node_type)0x0) {
              return (int)pnVar6;
            }
            __assert_fail("rightmost_->leaf()",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0xb4c,
                          "void phmap::priv::btree<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>>::verify() const [Params = phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>]"
                         );
          }
        }
      }
      __function = 
      "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
      ;
      goto LAB_001e05d6;
    }
  }
LAB_001e05aa:
  __function = 
  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
  ;
LAB_001e05d6:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,__function);
}

Assistant:

const node_type *root() const { return std::get<2>(root_); }